

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise_x86::destroy_pipeline(DeconvolutionDepthWise_x86 *this,Option *opt)

{
  pointer ppLVar1;
  pointer ppLVar2;
  long lVar3;
  
  ppLVar1 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar2 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppLVar2 - (long)ppLVar1) >> 3)) {
    lVar3 = 0;
    do {
      (*ppLVar1[lVar3]->_vptr_Layer[5])(ppLVar1[lVar3],opt);
      ppLVar1 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppLVar1[lVar3] != (Layer *)0x0) {
        (*ppLVar1[lVar3]->_vptr_Layer[1])();
        ppLVar1 = (this->group_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      lVar3 = lVar3 + 1;
      ppLVar2 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    } while (lVar3 < (int)((ulong)((long)ppLVar2 - (long)ppLVar1) >> 3));
  }
  if (ppLVar2 != ppLVar1) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar1;
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise_x86::destroy_pipeline(const Option& opt)
{
    for (int i = 0; i < (int)group_ops.size(); i++)
    {
        group_ops[i]->destroy_pipeline(opt);
        delete group_ops[i];
    }
    group_ops.clear();

    return 0;
}